

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O3

ostream * boost::unit_test::utils::operator<<
                    (custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::cdata_t>_>
                     *p,const_string *value)

{
  ostream *poVar1;
  long *local_58;
  long local_50;
  long local_48 [2];
  const_string local_38;
  
  poVar1 = p->m_ostr;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"<![CDATA[","");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_58,local_50);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  local_38.m_begin = value->m_begin;
  local_38.m_end = value->m_end;
  print_escaped_cdata(p->m_ostr,&local_38);
  poVar1 = p->m_ostr;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"]]>","");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_58,local_50);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return poVar1;
}

Assistant:

inline std::ostream&
operator<<( custom_printer<cdata> const& p, const_string value )
{
    *p << BOOST_TEST_L( "<![CDATA[" );
    print_escaped_cdata( *p, value );
    return  *p << BOOST_TEST_L( "]]>" );
}